

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O3

void __thiscall
ear::GainCalculatorDirectSpeakersImpl::calculate
          (GainCalculatorDirectSpeakersImpl *this,DirectSpeakersTypeMetadata *metadata,
          OutputGains *direct,WarningCB *warning_cb)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  long lVar3;
  string *psVar4;
  pointer pbVar5;
  pointer pcVar6;
  size_t __n;
  bool bVar7;
  OutputGains *pOVar8;
  undefined8 uVar9;
  bool isLfe;
  uint uVar10;
  int iVar11;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var12;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var13;
  optional<int> oVar14;
  internal_error *this_00;
  not_implemented *this_01;
  adm_error *this_02;
  undefined8 *puVar15;
  long lVar16;
  string *name;
  pointer pbVar17;
  size_type __dnew;
  VectorXd gains;
  SpeakerPosition shiftedPosition;
  string local_250;
  DirectSpeakersTypeMetadata *local_230;
  OutputGains *local_228;
  _Base_ptr local_220;
  undefined1 local_218 [8];
  DenseStorage<double,__1,__1,_1,_0> local_210;
  undefined8 *local_200;
  DenseStorage<double,__1,__1,_1,_0> local_1f8;
  undefined1 local_1e8 [208];
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  size_type local_108;
  variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition> local_100;
  
  if (((metadata->audioPackFormatID).super_type.m_initialized == true) &&
     ((metadata->speakerLabels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (metadata->speakerLabels).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    this_02 = (adm_error *)__cxa_allocate_exception(0x10);
    local_1e8._0_8_ = local_1e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1e8,
               "common definitions audioPackFormatID specified without any speakerLabels as specified in the common definitions file"
               ,"");
    adm_error::adm_error(this_02,(string *)local_1e8);
    __cxa_throw(this_02,&adm_error::typeinfo,std::invalid_argument::~invalid_argument);
  }
  (**direct->_vptr_OutputGains)(direct,(long)this->_nChannels);
  uVar10 = (metadata->position).which_;
  uVar10 = (int)uVar10 >> 0x1f ^ uVar10;
  if (uVar10 != 0) {
    switch(uVar10) {
    case 1:
      this_01 = (not_implemented *)__cxa_allocate_exception(0x10);
      local_1e8._0_8_ = local_1e8 + 0x10;
      local_250._M_dataplus._M_p = (pointer)0x12;
      local_1e8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1e8,(ulong)&local_250);
      local_1e8._16_8_ = local_250._M_dataplus._M_p;
      builtin_strncpy((char *)local_1e8._0_8_,"Cartesian position",0x12);
      local_1e8._8_8_ = local_250._M_dataplus._M_p;
      *(char *)(local_1e8._0_8_ + (long)local_250._M_dataplus._M_p) = '\0';
      not_implemented::not_implemented(this_01,(string *)local_1e8);
      __cxa_throw(this_01,&not_implemented::typeinfo,std::runtime_error::~runtime_error);
    default:
      boost::detail::variant::forced_return<void>();
    }
  }
  isLfe = _isLfeChannel(this,metadata,warning_cb);
  (*direct->_vptr_OutputGains[3])(direct);
  local_230 = metadata;
  local_228 = direct;
  if (((metadata->audioPackFormatID).super_type.m_initialized != true) ||
     (local_220 = (_Base_ptr)
                  std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)itu_packs_abi_cxx11_,
                         (key_type *)&(metadata->audioPackFormatID).super_type.m_storage),
     local_220 == (_Base_ptr)(itu_packs_abi_cxx11_ + 8))) goto LAB_00160101;
  _nominalSpeakerLabel
            (&local_250,this,
             (local_230->speakerLabels).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  bVar7 = true;
  local_200 = DAT_00210c30;
  if (rules != DAT_00210c30) {
    local_220 = local_220 + 2;
    puVar15 = rules;
    do {
      if ((puVar15[8] == puVar15[7]) ||
         (_Var12 = std::
                   __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                             (puVar15[7],puVar15[8],local_220),
         _Var12._M_current !=
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar15[8])) {
        if (puVar15[0xb] != puVar15[10]) {
          Layout::name_abi_cxx11_((string *)local_1e8,&this->_layout);
          _Var12 = std::
                   __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                             (puVar15[10],puVar15[0xb],local_1e8);
          pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar15[0xb]
          ;
          if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
            operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
          }
          if (_Var12._M_current == pbVar2) goto LAB_0016002a;
        }
        __n = CONCAT44(local_250._M_string_length._4_4_,(undefined4)local_250._M_string_length);
        if ((__n == puVar15[1]) &&
           ((__n == 0 ||
            (iVar11 = bcmp(local_250._M_dataplus._M_p,(void *)*puVar15,__n), iVar11 == 0)))) {
          lVar16 = puVar15[4];
          lVar3 = puVar15[5];
          if (lVar16 == lVar3) goto LAB_001600d1;
          while( true ) {
            Layout::channelNames_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1e8,&this->_layout);
            _Var12 = std::
                     __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                               (local_1e8._0_8_,local_1e8._8_8_,lVar16);
            uVar9 = local_1e8._8_8_;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1e8);
            pOVar8 = local_228;
            if (_Var12._M_current ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar9) break;
            lVar16 = lVar16 + 0x28;
            if (lVar16 == lVar3) {
              psVar4 = (string *)puVar15[5];
              for (name = (string *)puVar15[4]; name != psVar4;
                  name = (string *)&name[1]._M_string_length) {
                oVar14 = Layout::indexForName(&this->_layout,name);
                if (((ulong)oVar14.super_type & 1) == 0) {
                  this_00 = (internal_error *)__cxa_allocate_exception(0x10);
                  local_1e8._0_8_ = local_1e8 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_1e8,"mapping channel not found","");
                  internal_error::internal_error(this_00,(string *)local_1e8);
                  __cxa_throw(this_00,&internal_error::typeinfo,std::runtime_error::~runtime_error);
                }
                (*pOVar8->_vptr_OutputGains[2])
                          ((int)name[1]._M_dataplus._M_p,pOVar8,(long)oVar14.super_type >> 0x20);
              }
              goto LAB_001600d1;
            }
          }
        }
      }
LAB_0016002a:
      puVar15 = puVar15 + 0xd;
    } while (puVar15 != local_200);
    bVar7 = true;
  }
LAB_001600d8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if (!bVar7) {
    return;
  }
LAB_00160101:
  pbVar17 = (local_230->speakerLabels).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (local_230->speakerLabels).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar17 != pbVar5) {
    pcVar1 = local_1e8 + 0x10;
    do {
      pcVar6 = (pbVar17->_M_dataplus)._M_p;
      local_1e8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1e8,pcVar6,pcVar6 + pbVar17->_M_string_length);
      _nominalSpeakerLabel(&local_250,this,(string *)local_1e8);
      _Var13 = std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         ((this->_channelNames).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->_channelNames).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,&local_250);
      if (_Var13._M_current !=
          (this->_channelNames).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar16 = (long)(int)((ulong)((long)_Var13._M_current -
                                    (long)(this->_channelNames).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 5);
        if ((lVar16 < 0) ||
           ((this->_isLfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows <= lVar16)) {
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x19a,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Array<bool, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Array<bool, -1, 1>, Level = 1]"
                       );
        }
        if ((this->_isLfe).super_PlainObjectBase<Eigen::Array<bool,__1,_1,_0,__1,_1>_>.m_storage.
            m_data[lVar16] == isLfe) {
          (*local_228->_vptr_OutputGains[2])(0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          if ((pointer)local_1e8._0_8_ == pcVar1) {
            return;
          }
          operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
          return;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((pointer)local_1e8._0_8_ != pcVar1) {
        operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
      }
      pbVar17 = pbVar17 + 1;
    } while (pbVar17 != pbVar5);
  }
  _applyScreenEdgeLock((SpeakerPosition *)local_1e8,this,&local_230->position);
  oVar14 = _findChannelWithinBounds(this,(SpeakerPosition *)local_1e8,isLfe,1e-05);
  pOVar8 = local_228;
  if (((ulong)oVar14.super_type & 1) == 0) {
    if (isLfe) {
      _Var13 = std::
               __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[5]>>
                         ((this->_channelNames).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->_channelNames).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,"LFE1");
      if (_Var13._M_current !=
          (this->_channelNames).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        (*pOVar8->_vptr_OutputGains[2])
                  (0,pOVar8,(long)(int)((ulong)((long)_Var13._M_current -
                                               (long)(this->_channelNames).
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 5));
      }
    }
    else {
      boost::variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition>::variant
                (&local_100,
                 (variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition> *)local_1e8);
      toCartesianVector3d((Vector3d *)&local_250,&local_100);
      boost::variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition>::destroy_content
                (&local_100);
      local_108 = local_250.field_2._M_allocated_capacity;
      local_118 = local_250._M_dataplus._M_p._0_4_;
      uStack_114 = local_250._M_dataplus._M_p._4_4_;
      uStack_110 = (undefined4)local_250._M_string_length;
      uStack_10c = local_250._M_string_length._4_4_;
      (**((this->_pointSourcePanner).
          super___shared_ptr<ear::PointSourcePanner,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         _vptr_PointSourcePanner)(local_218);
      if (local_218[0] == '\0') {
        __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4bc,
                      "reference_type boost::optional<Eigen::Matrix<double, -1, 1>>::get() [T = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage(&local_1f8,&local_210);
      if (local_218[0] == '\x01') {
        free(local_210.m_data);
      }
      local_218 = (undefined1  [8])&this->_isLfe;
      mask_write<ear::OutputGains&,Eigen::CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,Eigen::Array<bool,_1,1,0,_1,1>const>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (pOVar8,(CwiseUnaryOp<Eigen::internal::scalar_boolean_not_op<bool>,_const_Eigen::Array<bool,__1,_1,_0,__1,_1>_>
                         *)local_218,(Matrix<double,__1,_1,_0,__1,_1> *)&local_1f8);
      free(local_1f8.m_data);
    }
  }
  else {
    (*local_228->_vptr_OutputGains[2])(0,local_228,(long)oVar14.super_type >> 0x20);
  }
  boost::variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition>::destroy_content
            ((variant<ear::PolarSpeakerPosition,_ear::CartesianSpeakerPosition> *)local_1e8);
  return;
LAB_001600d1:
  bVar7 = false;
  goto LAB_001600d8;
}

Assistant:

void GainCalculatorDirectSpeakersImpl::calculate(
      const DirectSpeakersTypeMetadata& metadata, OutputGains& direct,
      const WarningCB& warning_cb) {
    if (metadata.audioPackFormatID && metadata.speakerLabels.size() == 0)
      throw adm_error(
          "common definitions audioPackFormatID specified without any "
          "speakerLabels as specified in the common definitions file");
    direct.check_size(_nChannels);

    boost::apply_visitor(throw_if_not_implemented(), metadata.position);

    double tol = 1e-5;
    bool isLfe = _isLfeChannel(metadata, warning_cb);
    direct.zero();

    if (metadata.audioPackFormatID) {
      auto found_pack = itu_packs.find(metadata.audioPackFormatID.get());
      if (found_pack != itu_packs.end()) {
        const std::string& itu_layout_name = found_pack->second;
        std::string label = _nominalSpeakerLabel(metadata.speakerLabels[0]);

        for (const MappingRule& rule : rules) {
          if (rule_applies(rule, itu_layout_name, label, _layout)) {
            for (auto& channel_gain : rule.gains) {
              auto idx = _layout.indexForName(channel_gain.first);
              ear_assert((bool)idx, "mapping channel not found");
              direct.write(idx.get(), channel_gain.second);
            }
            return;
          }
        }
      }
    }

    // try to find a speaker that matches a speakerLabel and type; earlier
    // speakerLabel values have higher priority
    for (std::string speakerLabel : metadata.speakerLabels) {
      std::string nominalLabel = _nominalSpeakerLabel(speakerLabel);
      auto it =
          std::find(_channelNames.begin(), _channelNames.end(), nominalLabel);
      if (it != _channelNames.end()) {
        int index = static_cast<int>(std::distance(_channelNames.begin(), it));
        if (isLfe == _isLfe[index]) {
          direct.write(index, 1.0);
          return;
        }
      }
    }
    // shift the nominal speaker position to the screen edges if specified
    SpeakerPosition shiftedPosition = _applyScreenEdgeLock(metadata.position);

    // otherwise, find the closest speaker with the correct type within the
    // given bounds
    boost::optional<int> index =
        _findChannelWithinBounds(shiftedPosition, isLfe, tol);
    if (index) {
      direct.write(boost::get(index), 1.0);
      return;
    }

    // otherwise, use the point source panner for non-LFE, and handle LFE
    // channels using downmixing rules

    if (isLfe) {
      auto it = std::find(_channelNames.begin(), _channelNames.end(), "LFE1");
      if (it != _channelNames.end()) {
        int index = static_cast<int>(std::distance(_channelNames.begin(), it));
        direct.write(index, 1.0);
      }
      return;
    } else {
      Eigen::Vector3d pos = toCartesianVector3d(shiftedPosition);
      Eigen::VectorXd gains = _pointSourcePanner->handle(pos).get();
      mask_write(direct, !_isLfe, gains);
      return;
    }
  }